

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

void stringify_server_ID(uchar *ID,char *buffer,int len)

{
  ulong uVar1;
  ulong uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int in_EDX;
  char *in_RSI;
  ulong *in_RDI;
  int rep_len;
  version_3_format_ID *id3;
  version_1_format_ID id1;
  int i;
  int point;
  int id_size;
  void *in_stack_ffffffffffffff78;
  uint16_t uStack_2a;
  uint32_t uStack_28;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  iVar5 = version_of_format_ID(in_RDI);
  if (iVar5 == 0) {
    if (0xf < in_EDX) {
      for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
        iVar5 = snprintf(in_RSI + local_1c,(long)(in_EDX - local_1c),"%2x",
                         (ulong)*(byte *)((long)in_RDI + (long)local_20));
        local_1c = iVar5 + local_1c;
      }
    }
  }
  else if (iVar5 == 1) {
    uVar2 = *in_RDI;
    uVar1 = in_RDI[1];
    if (0x4d < in_EDX) {
      uStack_2a = (uint16_t)(uVar2 >> 0x10);
      uVar3 = ntohs(uStack_2a);
      uStack_28 = (uint32_t)(uVar2 >> 0x20);
      uVar7 = ntohl(uStack_28);
      uVar4 = ntohs((uint16_t)uVar1);
      snprintf(in_RSI,(long)in_EDX,"<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n",
               uVar2 & 0xff,uVar2 >> 8 & 0xff,(ulong)uVar3,uVar7,(uint)uVar4);
    }
  }
  else if (iVar5 == 2) {
    if (0x4d < in_EDX) {
      uVar6 = get_rep_len_format_ID(in_stack_ffffffffffffff78);
      uVar2 = *in_RDI;
      uVar7 = ntohl(*(uint32_t *)((long)in_RDI + 4));
      uVar8 = ntohl((uint32_t)in_RDI[1]);
      snprintf(in_RSI,(long)in_EDX,"<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n",
               (ulong)(byte)uVar2,(ulong)uVar6,(ulong)uVar7,uVar8);
    }
  }
  else if (0x1d < in_EDX) {
    snprintf(in_RSI,(long)in_EDX,"<Unknown format version %d\n",(ulong)(byte)*in_RDI);
  }
  return;
}

Assistant:

extern void
stringify_server_ID(unsigned char *ID, char *buffer, int len)
{
    int id_size = 8;
    int point = 0;
    int i;
    switch (version_of_format_ID(ID)) {
    case 0:
	if (len < id_size * 2) break;
	for (i = 0; i < id_size; i++) {
	    point += snprintf(&buffer[point], len - point, "%2x", ID[i]);
	}
	break;
    case 1:{
	version_1_format_ID id1;
	memcpy(&id1, ID, 10);
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	snprintf(buffer, len, "<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n",
	       id1.version, id1.salt, ntohs(id1.port),
	       ntohl(id1.IP_addr), ntohs(id1.format_identifier));
	    break;
	}
    case 2:{
	version_3_format_ID *id3 = (version_3_format_ID*)ID;
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	int rep_len = get_rep_len_format_ID(ID);
	snprintf(buffer, len, "<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n",
	       id3->version, rep_len,
	       ntohl(id3->hash1), ntohl(id3->hash2));
	    break;
	}
    default:
	if (len < 30) return;
	snprintf(buffer, len, "<Unknown format version %d\n",
	       *((unsigned char *) ID));
	break;
    }
}